

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

void __thiscall
Diligent::VkFormatToTexFormatMapper::VkFormatToTexFormatMapper(VkFormatToTexFormatMapper *this)

{
  mapped_type *pmVar1;
  VkFormatToTexFormatMapper *local_d0;
  key_type local_c8 [45];
  key_type local_14;
  VkFormatToTexFormatMapper *local_10;
  VkFormatToTexFormatMapper *this_local;
  
  local_d0 = this;
  do {
    local_d0->m_VkFmtToTexFmtMap[0] = TEX_FORMAT_UNKNOWN;
    local_d0 = (VkFormatToTexFormatMapper *)(local_d0->m_VkFmtToTexFmtMap + 1);
  } while (local_d0 != (VkFormatToTexFormatMapper *)&this->field_0x172);
  local_10 = this;
  std::
  unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
  ::unordered_map(&this->m_VkFmtToTexFmtMapExt);
  this->m_VkFmtToTexFmtMap[0] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[1] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[2] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[3] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[4] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[5] = TEX_FORMAT_B5G6R5_UNORM;
  this->m_VkFmtToTexFmtMap[6] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[7] = TEX_FORMAT_B5G5R5A1_UNORM;
  this->m_VkFmtToTexFmtMap[8] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[9] = TEX_FORMAT_R8_UNORM;
  this->m_VkFmtToTexFmtMap[10] = TEX_FORMAT_R8_SNORM;
  this->m_VkFmtToTexFmtMap[0xb] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xc] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xd] = TEX_FORMAT_R8_UINT;
  this->m_VkFmtToTexFmtMap[0xe] = TEX_FORMAT_R8_SINT;
  this->m_VkFmtToTexFmtMap[0xf] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x10] = TEX_FORMAT_RG8_UNORM;
  this->m_VkFmtToTexFmtMap[0x11] = TEX_FORMAT_RG8_SNORM;
  this->m_VkFmtToTexFmtMap[0x12] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x13] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x14] = TEX_FORMAT_RG8_UINT;
  this->m_VkFmtToTexFmtMap[0x15] = TEX_FORMAT_RG8_SINT;
  this->m_VkFmtToTexFmtMap[0x16] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x17] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x18] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x19] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x1a] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x1b] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x1c] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x1d] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x1e] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x1f] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x20] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x21] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x22] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x23] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x24] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x25] = TEX_FORMAT_RGBA8_UNORM;
  this->m_VkFmtToTexFmtMap[0x26] = TEX_FORMAT_RGBA8_SNORM;
  this->m_VkFmtToTexFmtMap[0x27] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x28] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x29] = TEX_FORMAT_RGBA8_UINT;
  this->m_VkFmtToTexFmtMap[0x2a] = TEX_FORMAT_RGBA8_SINT;
  this->m_VkFmtToTexFmtMap[0x2b] = TEX_FORMAT_RGBA8_UNORM_SRGB;
  this->m_VkFmtToTexFmtMap[0x2c] = TEX_FORMAT_BGRA8_UNORM;
  this->m_VkFmtToTexFmtMap[0x2d] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x2e] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x2f] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x30] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x31] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x32] = TEX_FORMAT_BGRA8_UNORM_SRGB;
  this->m_VkFmtToTexFmtMap[0x33] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x34] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x35] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x36] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x37] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x38] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x39] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x3a] = TEX_FORMAT_RGB10A2_UNORM;
  this->m_VkFmtToTexFmtMap[0x3b] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x3c] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x3d] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x3e] = TEX_FORMAT_RGB10A2_UINT;
  this->m_VkFmtToTexFmtMap[0x3f] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x40] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x41] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x42] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x43] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x44] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x45] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x46] = TEX_FORMAT_R16_UNORM;
  this->m_VkFmtToTexFmtMap[0x47] = TEX_FORMAT_R16_SNORM;
  this->m_VkFmtToTexFmtMap[0x48] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x49] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x4a] = TEX_FORMAT_R16_UINT;
  this->m_VkFmtToTexFmtMap[0x4b] = TEX_FORMAT_R16_SINT;
  this->m_VkFmtToTexFmtMap[0x4c] = TEX_FORMAT_R16_FLOAT;
  this->m_VkFmtToTexFmtMap[0x4d] = TEX_FORMAT_RG16_UNORM;
  this->m_VkFmtToTexFmtMap[0x4e] = TEX_FORMAT_RG16_SNORM;
  this->m_VkFmtToTexFmtMap[0x4f] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x50] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x51] = TEX_FORMAT_RG16_UINT;
  this->m_VkFmtToTexFmtMap[0x52] = TEX_FORMAT_RG16_SINT;
  this->m_VkFmtToTexFmtMap[0x53] = TEX_FORMAT_RG16_FLOAT;
  this->m_VkFmtToTexFmtMap[0x54] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x55] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x56] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x57] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x58] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x59] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x5a] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x5b] = TEX_FORMAT_RGBA16_UNORM;
  this->m_VkFmtToTexFmtMap[0x5c] = TEX_FORMAT_RGBA16_SNORM;
  this->m_VkFmtToTexFmtMap[0x5d] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x5e] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x5f] = TEX_FORMAT_RGBA16_UINT;
  this->m_VkFmtToTexFmtMap[0x60] = TEX_FORMAT_RGBA16_SINT;
  this->m_VkFmtToTexFmtMap[0x61] = TEX_FORMAT_RGBA16_FLOAT;
  this->m_VkFmtToTexFmtMap[0x62] = TEX_FORMAT_R32_UINT;
  this->m_VkFmtToTexFmtMap[99] = TEX_FORMAT_R32_SINT;
  this->m_VkFmtToTexFmtMap[100] = TEX_FORMAT_R32_FLOAT;
  this->m_VkFmtToTexFmtMap[0x65] = TEX_FORMAT_RG32_UINT;
  this->m_VkFmtToTexFmtMap[0x66] = TEX_FORMAT_RG32_SINT;
  this->m_VkFmtToTexFmtMap[0x67] = TEX_FORMAT_RG32_FLOAT;
  this->m_VkFmtToTexFmtMap[0x68] = TEX_FORMAT_RGB32_UINT;
  this->m_VkFmtToTexFmtMap[0x69] = TEX_FORMAT_RGB32_SINT;
  this->m_VkFmtToTexFmtMap[0x6a] = TEX_FORMAT_RGB32_FLOAT;
  this->m_VkFmtToTexFmtMap[0x6b] = TEX_FORMAT_RGBA32_UINT;
  this->m_VkFmtToTexFmtMap[0x6c] = TEX_FORMAT_RGBA32_SINT;
  this->m_VkFmtToTexFmtMap[0x6d] = TEX_FORMAT_RGBA32_FLOAT;
  this->m_VkFmtToTexFmtMap[0x6e] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x6f] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x70] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x71] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x72] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x73] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x74] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x75] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x76] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x77] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x78] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x79] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x7a] = TEX_FORMAT_R11G11B10_FLOAT;
  this->m_VkFmtToTexFmtMap[0x7b] = TEX_FORMAT_RGB9E5_SHAREDEXP;
  this->m_VkFmtToTexFmtMap[0x7c] = TEX_FORMAT_D16_UNORM;
  this->m_VkFmtToTexFmtMap[0x7d] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x7e] = TEX_FORMAT_D32_FLOAT;
  this->m_VkFmtToTexFmtMap[0x7f] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x80] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x81] = TEX_FORMAT_D24_UNORM_S8_UINT;
  this->m_VkFmtToTexFmtMap[0x82] = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  this->m_VkFmtToTexFmtMap[0x83] = TEX_FORMAT_BC1_UNORM;
  this->m_VkFmtToTexFmtMap[0x84] = TEX_FORMAT_BC1_UNORM_SRGB;
  this->m_VkFmtToTexFmtMap[0x85] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x86] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x87] = TEX_FORMAT_BC2_UNORM;
  this->m_VkFmtToTexFmtMap[0x88] = TEX_FORMAT_BC2_UNORM_SRGB;
  this->m_VkFmtToTexFmtMap[0x89] = TEX_FORMAT_BC3_UNORM;
  this->m_VkFmtToTexFmtMap[0x8a] = TEX_FORMAT_BC3_UNORM_SRGB;
  this->m_VkFmtToTexFmtMap[0x8b] = TEX_FORMAT_BC4_UNORM;
  this->m_VkFmtToTexFmtMap[0x8c] = TEX_FORMAT_BC4_SNORM;
  this->m_VkFmtToTexFmtMap[0x8d] = TEX_FORMAT_BC5_UNORM;
  this->m_VkFmtToTexFmtMap[0x8e] = TEX_FORMAT_BC5_SNORM;
  this->m_VkFmtToTexFmtMap[0x8f] = TEX_FORMAT_BC6H_UF16;
  this->m_VkFmtToTexFmtMap[0x90] = TEX_FORMAT_BC6H_SF16;
  this->m_VkFmtToTexFmtMap[0x91] = TEX_FORMAT_BC7_UNORM;
  this->m_VkFmtToTexFmtMap[0x92] = TEX_FORMAT_BC7_UNORM_SRGB;
  this->m_VkFmtToTexFmtMap[0x93] = TEX_FORMAT_ETC2_RGB8_UNORM;
  this->m_VkFmtToTexFmtMap[0x94] = TEX_FORMAT_ETC2_RGB8_UNORM_SRGB;
  this->m_VkFmtToTexFmtMap[0x95] = TEX_FORMAT_ETC2_RGB8A1_UNORM;
  this->m_VkFmtToTexFmtMap[0x96] = TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB;
  this->m_VkFmtToTexFmtMap[0x97] = TEX_FORMAT_ETC2_RGBA8_UNORM;
  this->m_VkFmtToTexFmtMap[0x98] = TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB;
  this->m_VkFmtToTexFmtMap[0x99] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x9a] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x9b] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x9c] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x9d] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x9e] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0x9f] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xa0] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xa1] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xa2] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xa3] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xa4] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xa5] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xa6] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xa7] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xa8] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xa9] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xaa] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xab] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xac] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xad] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xae] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xaf] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xb0] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xb1] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xb2] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xb3] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xb4] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xb5] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xb6] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xb7] = TEX_FORMAT_UNKNOWN;
  this->m_VkFmtToTexFmtMap[0xb8] = TEX_FORMAT_UNKNOWN;
  local_14 = VK_FORMAT_G8B8G8R8_422_UNORM;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,&local_14);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x28] = 0x3b9d2b61;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x28);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x27] = 0x3b9d2b62;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x27);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x26] = 0x3b9d2b63;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x26);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x25] = 0x3b9d2b64;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x25);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x24] = 0x3b9d2b65;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x24);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x23] = 0x3b9d2b66;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x23);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x22] = 0x3b9d2b67;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x22);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x21] = 0x3b9d2b68;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x21);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x20] = 0x3b9d2b69;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x20);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x1f] = 0x3b9d2b6a;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x1f);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x1e] = 0x3b9d2b6b;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x1e);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x1d] = 0x3b9d2b6c;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x1d);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x1c] = 0x3b9d2b6d;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x1c);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x1b] = 0x3b9d2b6e;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x1b);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x1a] = 0x3b9d2b6f;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x1a);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x19] = 0x3b9d2b70;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x19);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x18] = 0x3b9d2b71;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x18);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x17] = 0x3b9d2b72;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x17);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x16] = 0x3b9d2b73;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x16);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x15] = 0x3b9d2b74;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x15);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x14] = 0x3b9d2b75;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x14);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x13] = 0x3b9d2b76;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x13);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x12] = 0x3b9d2b77;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x12);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x11] = 0x3b9d2b78;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x11);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0x10] = 0x3b9d2b79;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0x10);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0xf] = 0x3b9d2b7a;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0xf);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0xe] = 0x3b9d2b7b;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0xe);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0xd] = 0x3b9d2b7c;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0xd);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0xc] = 0x3b9d2b7d;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0xc);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0xb] = 0x3b9d2b7e;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 0xb);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[10] = 0x3b9d2b7f;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 10);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[9] = 0x3b9d2b80;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 9);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[8] = 0x3b9d2b81;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 8);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[7] = 0x3b9b9cf0;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 7);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[6] = 0x3b9b9cf1;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 6);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[5] = 0x3b9b9cf2;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 5);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[4] = 0x3b9b9cf3;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 4);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[3] = 0x3b9b9cf4;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 3);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[2] = 0x3b9b9cf5;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 2);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[1] = 0x3b9b9cf6;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8 + 1);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  local_c8[0] = VK_FORMAT_PVRTC2_4BPP_SRGB_BLOCK_IMG;
  pmVar1 = std::
           unordered_map<VkFormat,_Diligent::TEXTURE_FORMAT,_std::hash<VkFormat>,_std::equal_to<VkFormat>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>_>
           ::operator[](&this->m_VkFmtToTexFmtMapExt,local_c8);
  *pmVar1 = TEX_FORMAT_UNKNOWN;
  return;
}

Assistant:

VkFormatToTexFormatMapper()
    {
        // clang-format off
        m_VkFmtToTexFmtMap[VK_FORMAT_UNDEFINED]                 = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R4G4_UNORM_PACK8]          = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R4G4B4A4_UNORM_PACK16]     = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_B4G4R4A4_UNORM_PACK16]     = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R5G6B5_UNORM_PACK16]       = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_B5G6R5_UNORM_PACK16]       = TEX_FORMAT_B5G6R5_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_R5G5B5A1_UNORM_PACK16]     = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_B5G5R5A1_UNORM_PACK16]     = TEX_FORMAT_B5G5R5A1_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_A1R5G5B5_UNORM_PACK16]     = TEX_FORMAT_UNKNOWN;

        m_VkFmtToTexFmtMap[VK_FORMAT_R8_UNORM]                  = TEX_FORMAT_R8_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8_SNORM]                  = TEX_FORMAT_R8_SNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8_USCALED]                = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8_SSCALED]                = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8_UINT]                   = TEX_FORMAT_R8_UINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8_SINT]                   = TEX_FORMAT_R8_SINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8_SRGB]                   = TEX_FORMAT_UNKNOWN;

        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8_UNORM]                = TEX_FORMAT_RG8_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8_SNORM]                = TEX_FORMAT_RG8_SNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8_USCALED]              = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8_SSCALED]              = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8_UINT]                 = TEX_FORMAT_RG8_UINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8_SINT]                 = TEX_FORMAT_RG8_SINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8_SRGB]                 = TEX_FORMAT_UNKNOWN;

        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8B8_UNORM]              = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8B8_SNORM]              = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8B8_USCALED]            = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8B8_SSCALED]            = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8B8_UINT]               = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8B8_SINT]               = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8B8_SRGB]               = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_B8G8R8_UNORM]              = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_B8G8R8_SNORM]              = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_B8G8R8_USCALED]            = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_B8G8R8_SSCALED]            = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_B8G8R8_UINT]               = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_B8G8R8_SINT]               = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_B8G8R8_SRGB]               = TEX_FORMAT_UNKNOWN;

        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8B8A8_UNORM]            = TEX_FORMAT_RGBA8_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8B8A8_SNORM]            = TEX_FORMAT_RGBA8_SNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8B8A8_USCALED]          = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8B8A8_SSCALED]          = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8B8A8_UINT]             = TEX_FORMAT_RGBA8_UINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8B8A8_SINT]             = TEX_FORMAT_RGBA8_SINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R8G8B8A8_SRGB]             = TEX_FORMAT_RGBA8_UNORM_SRGB;

        m_VkFmtToTexFmtMap[VK_FORMAT_B8G8R8A8_UNORM]            = TEX_FORMAT_BGRA8_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_B8G8R8A8_SNORM]            = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_B8G8R8A8_USCALED]          = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_B8G8R8A8_SSCALED]          = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_B8G8R8A8_UINT]             = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_B8G8R8A8_SINT]             = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_B8G8R8A8_SRGB]             = TEX_FORMAT_BGRA8_UNORM_SRGB;

        m_VkFmtToTexFmtMap[VK_FORMAT_A8B8G8R8_UNORM_PACK32]     = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_A8B8G8R8_SNORM_PACK32]     = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_A8B8G8R8_USCALED_PACK32]   = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_A8B8G8R8_SSCALED_PACK32]   = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_A8B8G8R8_UINT_PACK32]      = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_A8B8G8R8_SINT_PACK32]      = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_A8B8G8R8_SRGB_PACK32]      = TEX_FORMAT_UNKNOWN;

        m_VkFmtToTexFmtMap[VK_FORMAT_A2R10G10B10_UNORM_PACK32]  = TEX_FORMAT_RGB10A2_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_A2R10G10B10_SNORM_PACK32]  = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_A2R10G10B10_USCALED_PACK32]    = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_A2R10G10B10_SSCALED_PACK32]    = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_A2R10G10B10_UINT_PACK32]       = TEX_FORMAT_RGB10A2_UINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_A2R10G10B10_SINT_PACK32]       = TEX_FORMAT_UNKNOWN;

        m_VkFmtToTexFmtMap[VK_FORMAT_A2B10G10R10_UNORM_PACK32]      = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_A2B10G10R10_SNORM_PACK32]      = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_A2B10G10R10_USCALED_PACK32]    = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_A2B10G10R10_SSCALED_PACK32]    = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_A2B10G10R10_UINT_PACK32]       = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_A2B10G10R10_SINT_PACK32]       = TEX_FORMAT_UNKNOWN;

        m_VkFmtToTexFmtMap[VK_FORMAT_R16_UNORM]             = TEX_FORMAT_R16_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16_SNORM]             = TEX_FORMAT_R16_SNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16_USCALED]           = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16_SSCALED]           = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16_UINT]              = TEX_FORMAT_R16_UINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16_SINT]              = TEX_FORMAT_R16_SINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16_SFLOAT]            = TEX_FORMAT_R16_FLOAT;

        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16_UNORM]          = TEX_FORMAT_RG16_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16_SNORM]          = TEX_FORMAT_RG16_SNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16_USCALED]        = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16_SSCALED]        = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16_UINT]           = TEX_FORMAT_RG16_UINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16_SINT]           = TEX_FORMAT_RG16_SINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16_SFLOAT]         = TEX_FORMAT_RG16_FLOAT;

        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16B16_UNORM]       = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16B16_SNORM]       = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16B16_USCALED]     = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16B16_SSCALED]     = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16B16_UINT]        = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16B16_SINT]        = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16B16_SFLOAT]      = TEX_FORMAT_UNKNOWN;

        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16B16A16_UNORM]    = TEX_FORMAT_RGBA16_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16B16A16_SNORM]    = TEX_FORMAT_RGBA16_SNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16B16A16_USCALED]  = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16B16A16_SSCALED]  = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16B16A16_UINT]     = TEX_FORMAT_RGBA16_UINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16B16A16_SINT]     = TEX_FORMAT_RGBA16_SINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R16G16B16A16_SFLOAT]   = TEX_FORMAT_RGBA16_FLOAT;

        m_VkFmtToTexFmtMap[VK_FORMAT_R32_UINT]              = TEX_FORMAT_R32_UINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R32_SINT]              = TEX_FORMAT_R32_SINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R32_SFLOAT]            = TEX_FORMAT_R32_FLOAT;

        m_VkFmtToTexFmtMap[VK_FORMAT_R32G32_UINT]           = TEX_FORMAT_RG32_UINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R32G32_SINT]           = TEX_FORMAT_RG32_SINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R32G32_SFLOAT]         = TEX_FORMAT_RG32_FLOAT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R32G32B32_UINT]        = TEX_FORMAT_RGB32_UINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R32G32B32_SINT]        = TEX_FORMAT_RGB32_SINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R32G32B32_SFLOAT]      = TEX_FORMAT_RGB32_FLOAT;

        m_VkFmtToTexFmtMap[VK_FORMAT_R32G32B32A32_UINT]     = TEX_FORMAT_RGBA32_UINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R32G32B32A32_SINT]     = TEX_FORMAT_RGBA32_SINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_R32G32B32A32_SFLOAT]   = TEX_FORMAT_RGBA32_FLOAT;

        m_VkFmtToTexFmtMap[VK_FORMAT_R64_UINT]              = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R64_SINT]              = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R64_SFLOAT]            = TEX_FORMAT_UNKNOWN;

        m_VkFmtToTexFmtMap[VK_FORMAT_R64G64_UINT]           = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R64G64_SINT]           = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R64G64_SFLOAT]         = TEX_FORMAT_UNKNOWN;

        m_VkFmtToTexFmtMap[VK_FORMAT_R64G64B64_UINT]        = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R64G64B64_SINT]        = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R64G64B64_SFLOAT]      = TEX_FORMAT_UNKNOWN;

        m_VkFmtToTexFmtMap[VK_FORMAT_R64G64B64A64_UINT]     = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R64G64B64A64_SINT]     = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_R64G64B64A64_SFLOAT]   = TEX_FORMAT_UNKNOWN;

        m_VkFmtToTexFmtMap[VK_FORMAT_B10G11R11_UFLOAT_PACK32]   = TEX_FORMAT_R11G11B10_FLOAT;
        m_VkFmtToTexFmtMap[VK_FORMAT_E5B9G9R9_UFLOAT_PACK32]    = TEX_FORMAT_RGB9E5_SHAREDEXP;
        m_VkFmtToTexFmtMap[VK_FORMAT_D16_UNORM]                 = TEX_FORMAT_D16_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_X8_D24_UNORM_PACK32]       = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_D32_SFLOAT]                = TEX_FORMAT_D32_FLOAT;
        m_VkFmtToTexFmtMap[VK_FORMAT_S8_UINT]                   = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_D16_UNORM_S8_UINT]         = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_D24_UNORM_S8_UINT]         = TEX_FORMAT_D24_UNORM_S8_UINT;
        m_VkFmtToTexFmtMap[VK_FORMAT_D32_SFLOAT_S8_UINT]        = TEX_FORMAT_D32_FLOAT_S8X24_UINT;

        m_VkFmtToTexFmtMap[VK_FORMAT_BC1_RGB_UNORM_BLOCK]       = TEX_FORMAT_BC1_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_BC1_RGB_SRGB_BLOCK]        = TEX_FORMAT_BC1_UNORM_SRGB;
        m_VkFmtToTexFmtMap[VK_FORMAT_BC1_RGBA_UNORM_BLOCK]      = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_BC1_RGBA_SRGB_BLOCK]       = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_BC2_UNORM_BLOCK]           = TEX_FORMAT_BC2_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_BC2_SRGB_BLOCK]            = TEX_FORMAT_BC2_UNORM_SRGB;
        m_VkFmtToTexFmtMap[VK_FORMAT_BC3_UNORM_BLOCK]           = TEX_FORMAT_BC3_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_BC3_SRGB_BLOCK]            = TEX_FORMAT_BC3_UNORM_SRGB;
        m_VkFmtToTexFmtMap[VK_FORMAT_BC4_UNORM_BLOCK]           = TEX_FORMAT_BC4_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_BC4_SNORM_BLOCK]           = TEX_FORMAT_BC4_SNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_BC5_UNORM_BLOCK]           = TEX_FORMAT_BC5_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_BC5_SNORM_BLOCK]           = TEX_FORMAT_BC5_SNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_BC6H_UFLOAT_BLOCK]         = TEX_FORMAT_BC6H_UF16;
        m_VkFmtToTexFmtMap[VK_FORMAT_BC6H_SFLOAT_BLOCK]         = TEX_FORMAT_BC6H_SF16;
        m_VkFmtToTexFmtMap[VK_FORMAT_BC7_UNORM_BLOCK]           = TEX_FORMAT_BC7_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_BC7_SRGB_BLOCK]            = TEX_FORMAT_BC7_UNORM_SRGB;

        m_VkFmtToTexFmtMap[VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK]   = TEX_FORMAT_ETC2_RGB8_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK]    = TEX_FORMAT_ETC2_RGB8_UNORM_SRGB;
        m_VkFmtToTexFmtMap[VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK] = TEX_FORMAT_ETC2_RGB8A1_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK]  = TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB;
        m_VkFmtToTexFmtMap[VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK] = TEX_FORMAT_ETC2_RGBA8_UNORM;
        m_VkFmtToTexFmtMap[VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK]  = TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB;

        m_VkFmtToTexFmtMap[VK_FORMAT_EAC_R11_UNORM_BLOCK]       = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_EAC_R11_SNORM_BLOCK]       = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_EAC_R11G11_UNORM_BLOCK]    = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_EAC_R11G11_SNORM_BLOCK]    = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_4x4_UNORM_BLOCK]      = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_4x4_SRGB_BLOCK]       = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_5x4_UNORM_BLOCK]      = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_5x4_SRGB_BLOCK]       = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_5x5_UNORM_BLOCK]      = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_5x5_SRGB_BLOCK]       = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_6x5_UNORM_BLOCK]      = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_6x5_SRGB_BLOCK]       = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_6x6_UNORM_BLOCK]      = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_6x6_SRGB_BLOCK]       = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_8x5_UNORM_BLOCK]      = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_8x5_SRGB_BLOCK]       = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_8x6_UNORM_BLOCK]      = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_8x6_SRGB_BLOCK]       = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_8x8_UNORM_BLOCK]      = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_8x8_SRGB_BLOCK]       = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_10x5_UNORM_BLOCK]     = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_10x5_SRGB_BLOCK]      = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_10x6_UNORM_BLOCK]     = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_10x6_SRGB_BLOCK]      = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_10x8_UNORM_BLOCK]     = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_10x8_SRGB_BLOCK]      = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_10x10_UNORM_BLOCK]    = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_10x10_SRGB_BLOCK]     = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_12x10_UNORM_BLOCK]    = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_12x10_SRGB_BLOCK]     = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_12x12_UNORM_BLOCK]    = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMap[VK_FORMAT_ASTC_12x12_SRGB_BLOCK]     = TEX_FORMAT_UNKNOWN;



        m_VkFmtToTexFmtMapExt[VK_FORMAT_G8B8G8R8_422_UNORM] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_B8G8R8G8_422_UNORM] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G8_B8_R8_3PLANE_420_UNORM]  = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G8_B8R8_2PLANE_420_UNORM]   = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G8_B8_R8_3PLANE_422_UNORM]  = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G8_B8R8_2PLANE_422_UNORM]   = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G8_B8_R8_3PLANE_444_UNORM]  = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_R10X6_UNORM_PACK16] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_R10X6G10X6_UNORM_2PACK16] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_R10X6G10X6B10X6A10X6_UNORM_4PACK16]     = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G10X6B10X6G10X6R10X6_422_UNORM_4PACK16] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_B10X6G10X6R10X6G10X6_422_UNORM_4PACK16] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G10X6_B10X6_R10X6_3PLANE_420_UNORM_3PACK16] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G10X6_B10X6R10X6_2PLANE_420_UNORM_3PACK16]  = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G10X6_B10X6_R10X6_3PLANE_422_UNORM_3PACK16] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G10X6_B10X6R10X6_2PLANE_422_UNORM_3PACK16]  = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G10X6_B10X6_R10X6_3PLANE_444_UNORM_3PACK16] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_R12X4_UNORM_PACK16] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_R12X4G12X4_UNORM_2PACK16] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_R12X4G12X4B12X4A12X4_UNORM_4PACK16] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G12X4B12X4G12X4R12X4_422_UNORM_4PACK16] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_B12X4G12X4R12X4G12X4_422_UNORM_4PACK16] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G12X4_B12X4_R12X4_3PLANE_420_UNORM_3PACK16] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G12X4_B12X4R12X4_2PLANE_420_UNORM_3PACK16]  = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G12X4_B12X4_R12X4_3PLANE_422_UNORM_3PACK16] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G12X4_B12X4R12X4_2PLANE_422_UNORM_3PACK16]  = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G12X4_B12X4_R12X4_3PLANE_444_UNORM_3PACK16] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G16B16G16R16_422_UNORM] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_B16G16R16G16_422_UNORM] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G16_B16_R16_3PLANE_420_UNORM] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G16_B16R16_2PLANE_420_UNORM]  = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G16_B16_R16_3PLANE_422_UNORM] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G16_B16R16_2PLANE_422_UNORM]  = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_G16_B16_R16_3PLANE_444_UNORM] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_PVRTC1_2BPP_UNORM_BLOCK_IMG] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_PVRTC1_4BPP_UNORM_BLOCK_IMG] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_PVRTC2_2BPP_UNORM_BLOCK_IMG] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_PVRTC2_4BPP_UNORM_BLOCK_IMG] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_PVRTC1_2BPP_SRGB_BLOCK_IMG] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_PVRTC1_4BPP_SRGB_BLOCK_IMG] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_PVRTC2_2BPP_SRGB_BLOCK_IMG] = TEX_FORMAT_UNKNOWN;
        m_VkFmtToTexFmtMapExt[VK_FORMAT_PVRTC2_4BPP_SRGB_BLOCK_IMG] = TEX_FORMAT_UNKNOWN;
        // clang-format on
    }